

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-cbor.c
# Opt level: O0

void cn_cbor_free(cn_cbor *cb)

{
  cn_cbor *pcVar1;
  cn_cbor *local_20;
  cn_cbor *p1;
  cn_cbor *p;
  cn_cbor *cb_local;
  
  p1 = cb;
  if ((cb != (cn_cbor *)0x0) && (cb->parent != (cn_cbor *)0x0)) {
    __assert_fail("!p || !p->parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-cbor.c"
                  ,0x22,"void cn_cbor_free(cn_cbor *)");
  }
  while (pcVar1 = p1, p1 != (cn_cbor *)0x0) {
    do {
      p1 = pcVar1;
      pcVar1 = p1->first_child;
    } while (p1->first_child != (cn_cbor *)0x0);
    local_20 = p1->next;
    if ((local_20 == (cn_cbor *)0x0) && (local_20 = p1->parent, local_20 != (cn_cbor *)0x0)) {
      local_20->first_child = (cn_cbor *)0x0;
    }
    free(p1);
    p1 = local_20;
  }
  return;
}

Assistant:

MYLIB_EXPORT
void cn_cbor_free(cn_cbor* cb CBOR_CONTEXT) {
  cn_cbor* p = (cn_cbor*) cb;
  assert(!p || !p->parent);
  while (p) {
    cn_cbor* p1;
    while ((p1 = p->first_child)) { /* go down */
      p = p1;
    }
    if (!(p1 = p->next)) {   /* go up next */
      if ((p1 = p->parent))
        p1->first_child = 0;
    }
    CN_CBOR_FREE_CONTEXT(p);
    p = p1;
  }
}